

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

uint strhashl(char *s,int l)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  
  lVar1 = 0;
  if (l < 1) {
    l = 0;
  }
  uVar3 = 0;
  for (; l != (int)lVar1; lVar1 = lVar1 + 1) {
    uVar2 = (int)s[lVar1] + uVar3 * 0x10;
    uVar3 = uVar2 & 0xfffffff ^ uVar2 >> 0x18 & 0xfffffff0;
  }
  return uVar3;
}

Assistant:

uint strhashl(const char *s, int l) {
  uint h = 0, g;
  int i = 0;

  for (; i < l; i++, s++) {
    h = (h << 4) + *s;
    if ((g = h & 0xf0000000)) h = (h ^ (g >> 24)) ^ g;
  }
  return h;
}